

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

float Am_Slow_In_Slow_Out_proc(Am_Object *interp,Am_Time *t)

{
  Am_Value *pAVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float tau;
  float D_1;
  float D_0;
  Am_Time local_30;
  Am_Object local_28;
  float local_1c;
  Am_Time *pAStack_18;
  float fraction;
  Am_Time *t_local;
  Am_Object *interp_local;
  
  pAStack_18 = t;
  t_local = (Am_Time *)interp;
  Am_Object::Am_Object(&local_28,interp);
  Am_Time::Am_Time(&local_30,t);
  fVar2 = Am_Linear_Timing_proc(&local_28,&local_30);
  Am_Time::~Am_Time(&local_30);
  Am_Object::~Am_Object(&local_28);
  local_1c = fVar2;
  pAVar1 = Am_Object::Get(interp,0x105,0);
  fVar2 = Am_Value::operator_cast_to_float(pAVar1);
  pAVar1 = Am_Object::Get(interp,0x106,0);
  fVar3 = Am_Value::operator_cast_to_float(pAVar1);
  dVar4 = std::atan((double)(ulong)(uint)((fVar2 + fVar3) * local_1c + -fVar2));
  dVar5 = std::atan((double)(ulong)(uint)fVar2);
  dVar6 = std::atan((double)(ulong)(uint)fVar2);
  dVar7 = std::atan((double)(ulong)(uint)fVar3);
  return (SUB84(dVar4,0) + SUB84(dVar5,0)) / (SUB84(dVar6,0) + SUB84(dVar7,0));
}

Assistant:

Am_Define_Method(Am_Timing_Function, float, Am_Slow_In_Slow_Out,
                 (Am_Object interp, Am_Time t))
{
  float fraction = Am_Linear_Timing_proc(interp, t);

  float D_0 = interp.Get(Am_SHARPNESS_1);
  float D_1 = interp.Get(Am_SHARPNESS_2);

  float tau = (float)((atan((D_0 + D_1) * fraction - D_0) + atan(D_0)) /
                      (atan(D_0) + atan(D_1)));

  return tau;
}